

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_mysql.cpp
# Opt level: O2

void __thiscall QMYSQLDriver::QMYSQLDriver(QMYSQLDriver *this,QObject *parent)

{
  QMYSQLDriverPrivate *this_00;
  
  this_00 = (QMYSQLDriverPrivate *)operator_new(0xd0);
  QMYSQLDriverPrivate::QMYSQLDriverPrivate(this_00);
  QSqlDriver::QSqlDriver((QSqlDriver *)this,(QSqlDriverPrivate *)this_00,parent);
  *(undefined ***)this = &PTR_metaObject_00119168;
  *(undefined8 *)(*(long *)(this + 8) + 0xa8) = 0;
  qMySqlConnectionCount = qMySqlConnectionCount + 1;
  qLibraryInit();
  return;
}

Assistant:

QMYSQLDriver::QMYSQLDriver(QObject * parent)
    : QSqlDriver(*new QMYSQLDriverPrivate, parent)
{
    init();
    qLibraryInit();
}